

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>
fmt::v5::internal::
format_decimal<char,unsigned_int,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,fmt::v5::internal::add_thousands_sep<char>>
          (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> out,uint value,
          int num_digits,add_thousands_sep<char> sep)

{
  add_thousands_sep<char> thousands_sep;
  type tVar1;
  char *in_stack_00000008;
  char *in_stack_00000010;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> in_stack_00000018;
  char *end;
  char_type buffer [13];
  undefined8 in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8 [16];
  
  thousands_sep._8_16_ = in_stack_ffffffffffffffd8;
  thousands_sep.sep_.data_ = in_stack_ffffffffffffffd0;
  format_decimal<unsigned_int,char,fmt::v5::internal::add_thousands_sep<char>>
            (in_stack_00000008,(uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
             (int)in_stack_ffffffffffffffb0,thousands_sep);
  tVar1 = copy_str<char,char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (in_stack_00000010,in_stack_00000008,in_stack_00000018);
  return (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)tVar1.container;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}